

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall ArgsManager::GetSettingsPath(ArgsManager *this,path *filepath,bool temp,bool backup)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  string *in_RSI;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  path settings;
  path *in_stack_fffffffffffffe88;
  ArgsManager *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  bool local_149;
  path *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  ArgsManager *this_00;
  bool local_11a;
  allocator<char> local_119 [273];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_DL & 1;
  bVar1 = in_CL & 1;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)in_RSI,
             (allocator<char> *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_fffffffffffffec8)));
  fs::path::path((path *)0x18ff7bf,(char *)in_stack_fffffffffffffe88);
  GetPathArg(this_00,in_RSI,(path *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_fffffffffffffec8)));
  fs::path::~path((path *)in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe88->_M_pathname);
  std::allocator<char>::~allocator(local_119);
  bVar2 = std::filesystem::__cxx11::path::empty(in_stack_fffffffffffffe88);
  if (bVar2) {
    local_11a = false;
  }
  else {
    if ((bVar1 & 1) != 0) {
      std::filesystem::__cxx11::path::operator+=
                ((path *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (value_type *)in_stack_fffffffffffffe90);
    }
    if (in_RSI != (string *)0x0) {
      GetDataDirNet(in_stack_fffffffffffffe90);
      local_149 = (bVar3 & 1) == 0;
      if (local_149) {
        fs::path::path((path *)in_stack_fffffffffffffe88,(path *)0x18ff93f);
      }
      else {
        fs::path::path((path *)in_stack_fffffffffffffe88,(path *)0x18ff906);
        fs::operator+((path *)in_RDI,
                      (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      }
      local_149 = !local_149;
      fsbridge::AbsPathJoin
                ((path *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_fffffffffffffec8)),
                 in_stack_fffffffffffffec0);
      fs::path::operator=((path *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                          (path *)in_stack_fffffffffffffe90);
      fs::path::~path((path *)in_stack_fffffffffffffe88);
      fs::path::~path((path *)in_stack_fffffffffffffe88);
      if (local_149) {
        fs::path::~path((path *)in_stack_fffffffffffffe88);
      }
      fs::path::~path((path *)in_stack_fffffffffffffe88);
    }
    local_11a = true;
  }
  fs::path::~path((path *)in_stack_fffffffffffffe88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_11a;
}

Assistant:

bool ArgsManager::GetSettingsPath(fs::path* filepath, bool temp, bool backup) const
{
    fs::path settings = GetPathArg("-settings", BITCOIN_SETTINGS_FILENAME);
    if (settings.empty()) {
        return false;
    }
    if (backup) {
        settings += ".bak";
    }
    if (filepath) {
        *filepath = fsbridge::AbsPathJoin(GetDataDirNet(), temp ? settings + ".tmp" : settings);
    }
    return true;
}